

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O0

ion_status_t oafh_get(ion_file_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  ion_status_t iVar1;
  ion_err_t iVar2;
  int local_2c;
  int record_size;
  int loc;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_file_hashmap_t *hash_map_local;
  
  _record_size = value;
  value_local = key;
  key_local = hash_map;
  iVar2 = oafh_find_item_loc(hash_map,key,&local_2c);
  if (iVar2 != '\0') {
    hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,1);
  }
  else {
    fseek(*(FILE **)((long)key_local + 0x30),
          (long)(local_2c * (*(int *)((long)key_local + 4) + *(int *)((long)key_local + 8) + 1) + 1
                + *(int *)((long)key_local + 4)),0);
    fread(_record_size,(long)*(int *)((long)key_local + 8),1,*(FILE **)((long)key_local + 0x30));
    hash_map_local._0_4_ = (uint)hash_map_local & 0xffffff00;
  }
  iVar1.count._0_1_ = iVar2 == '\0';
  iVar1._0_4_ = (uint)hash_map_local;
  iVar1.count._1_3_ = 0;
  return iVar1;
}

Assistant:

ion_status_t
oafh_get(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key,
	ion_value_t			value
) {
	int loc;

	if (oafh_find_item_loc(hash_map, key, &loc) == err_ok) {
#if ION_DEBUG
		printf("Item found at location %d\n", loc);
#endif

		int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

		/* set file position */
		fseek(hash_map->file, (loc * record_size) + SIZEOF(STATUS) + hash_map->super.record.key_size, SEEK_SET);
#if ION_DEBUG
		printf("seeking %i\n", (loc * record_size) + SIZEOF(STATUS) + hash_map->super.record.key_size);
#endif
		fread(value, hash_map->super.record.value_size, 1, hash_map->file);

		return ION_STATUS_OK(1);
	}
	else {
#if ION_DEBUG
		printf("Item not found in hash table.\n");
#endif
		value = NULL;	/*et the number of bytes to 0 */
		return ION_STATUS_ERROR(err_item_not_found);
	}
}